

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
* __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>
::GetConstraint(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>
                *this,int i)

{
  reference pCVar1;
  
  pCVar1 = std::
           _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container_*>
           ::operator[](&(this->cons_).
                         super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container>_>
                         ._M_impl.super__Deque_impl_data._M_start,(long)i);
  return (CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
          *)pCVar1;
}

Assistant:

const Constraint& GetConstraint(int i) const
  { assert(check_index(i)); return cons_[i].GetCon(); }